

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O2

void share_closing(Plug *plug,PlugCloseType type,char *error_msg)

{
  if ((type != PLUGCLOSE_NORMAL) &&
     ((type != PLUGCLOSE_BROKEN_PIPE || (*(char *)((long)&plug[-0x80d].vt + 5) == '\x01')))) {
    log_downstream((ssh_sharing_connstate *)(plug + -0x810),"Socket error: %s");
  }
  share_begin_cleanup((ssh_sharing_connstate *)(plug + -0x810));
  return;
}

Assistant:

static void share_closing(Plug *plug, PlugCloseType type,
                          const char *error_msg)
{
    struct ssh_sharing_connstate *cs = container_of(
        plug, struct ssh_sharing_connstate, plug);

    /*
     * Most of the time, we log what went wrong when a downstream
     * disappears with a socket error. One exception, though, is
     * receiving EPIPE when we haven't received a protocol version
     * string from the downstream, because that can happen as a result
     * of plink -shareexists (opening the connection and instantly
     * closing it again without bothering to read our version string).
     * So that one case is not treated as a log-worthy error.
     */
    if (type == PLUGCLOSE_BROKEN_PIPE && !cs->got_verstring) {
        /* do nothing */;
    } else if (type != PLUGCLOSE_NORMAL) {
        log_downstream(cs, "Socket error: %s", error_msg);
    }
    share_begin_cleanup(cs);
}